

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.h
# Opt level: O0

void __thiscall hwnet::any::_destroy(any *this)

{
  int iVar1;
  any *this_local;
  
  if (((this->counter != (int *)0x0) && (this->content != (placeholder *)0x0)) &&
     (iVar1 = *this->counter + -1, *this->counter = iVar1, iVar1 < 1)) {
    if (this->counter != (int *)0x0) {
      operator_delete(this->counter,4);
    }
    if (this->content != (placeholder *)0x0) {
      (*this->content->_vptr_placeholder[1])();
    }
  }
  return;
}

Assistant:

void _destroy()
	{
		if(counter && content && --*counter <= 0)
		{
			delete counter;
			delete content;
		}
	}